

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_Parser.cpp
# Opt level: O2

void __thiscall
psy::C::Parser::DiagnosticsReporter::AmbiguousCastOrBinaryExpression
          (DiagnosticsReporter *this,AmbiguousCastOrBinaryExpressionSyntax *node)

{
  SyntaxToken *this_00;
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0;
  string s;
  DiagnosticDescriptor local_80;
  
  this_00 = peek(this->parser_,1);
  SyntaxToken::valueText_abi_cxx11_(&local_c0,this_00);
  std::operator+(&local_80.id_,"ambiguous cast or binary expression `",&local_c0);
  std::operator+(&s,&local_80.id_,"\'");
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string(local_e0,(string *)&ID_of_AmbiguousCastOrBinaryExpression_abi_cxx11_)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            (local_100,"[[ambiguous cast or binary expression]]",(allocator<char> *)&local_c0);
  std::__cxx11::string::string(local_120,(string *)&s);
  psy::DiagnosticDescriptor::DiagnosticDescriptor(&local_80,local_e0,local_100,local_120,2,1);
  retainAmbiguityDiagnostic(this,&local_80,(SyntaxNode *)node);
  DiagnosticDescriptor::~DiagnosticDescriptor(&local_80);
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string((string *)&s);
  return;
}

Assistant:

void Parser::DiagnosticsReporter::AmbiguousCastOrBinaryExpression(
        const AmbiguousCastOrBinaryExpressionSyntax* node)
{
    std::string s = "ambiguous cast or binary expression `"
            + parser_->peek().valueText()
            + "'";

    retainAmbiguityDiagnostic(
                DiagnosticDescriptor(ID_of_AmbiguousCastOrBinaryExpression,
                                     "[[ambiguous cast or binary expression]]",
                                     s,
                                     DiagnosticSeverity::Error,
                                     DiagnosticCategory::Syntax),
                node);
}